

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiListClipper::End(ImGuiListClipper *this)

{
  long lVar1;
  int iVar2;
  ImGuiListClipperData *pIVar3;
  int *in_RDI;
  ImGuiListClipperData *data;
  ImGuiContext *g;
  ImGuiContext *pIVar4;
  
  lVar1 = *(long *)(in_RDI + 6);
  if (lVar1 != 0) {
    pIVar4 = GImGui;
    if (((-1 < in_RDI[2]) && (in_RDI[2] < 0x7fffffff)) && (-1 < *in_RDI)) {
      ImGuiListClipper_SeekCursorForItem((ImGuiListClipper *)GImGui,(int)((ulong)lVar1 >> 0x20));
    }
    *(undefined4 *)(lVar1 + 0xc) = *(undefined4 *)(lVar1 + 0x18);
    iVar2 = pIVar4->ClipperTempDataStacked + -1;
    pIVar4->ClipperTempDataStacked = iVar2;
    if (0 < iVar2) {
      pIVar3 = ImVector<ImGuiListClipperData>::operator[]
                         (&pIVar4->ClipperTempData,pIVar4->ClipperTempDataStacked + -1);
      pIVar3->ListClipper->TempData = pIVar3;
    }
    in_RDI[6] = 0;
    in_RDI[7] = 0;
  }
  in_RDI[2] = -1;
  return;
}

Assistant:

void ImGuiListClipper::End()
{
    ImGuiContext& g = *GImGui;
    if (ImGuiListClipperData* data = (ImGuiListClipperData*)TempData)
    {
        // In theory here we should assert that we are already at the right position, but it seems saner to just seek at the end and not assert/crash the user.
        if (ItemsCount >= 0 && ItemsCount < INT_MAX && DisplayStart >= 0)
            ImGuiListClipper_SeekCursorForItem(this, ItemsCount);

        // Restore temporary buffer and fix back pointers which may be invalidated when nesting
        IM_ASSERT(data->ListClipper == this);
        data->StepNo = data->Ranges.Size;
        if (--g.ClipperTempDataStacked > 0)
        {
            data = &g.ClipperTempData[g.ClipperTempDataStacked - 1];
            data->ListClipper->TempData = data;
        }
        TempData = NULL;
    }
    ItemsCount = -1;
}